

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXNodeAttribute.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::NodeAttribute::NodeAttribute
          (NodeAttribute *this,uint64_t id,Element *element,Document *doc,string *name)

{
  int iVar1;
  Scope *sc;
  Token *this_00;
  Token *t;
  bool no_warn;
  __shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2> local_80;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__LimbNode_007f8b78;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sc = GetRequiredScope(element);
  this_00 = GetRequiredToken(element,2);
  ParseTokenAsString_abi_cxx11_(&local_70,(FBX *)this_00,t);
  iVar1 = strcmp(local_70._M_dataplus._M_p,"Null");
  if (iVar1 == 0) {
    no_warn = true;
  }
  else {
    iVar1 = strcmp(local_70._M_dataplus._M_p,"LimbNode");
    no_warn = iVar1 == 0;
  }
  std::operator+(&local_50,"NodeAttribute.Fbx",&local_70);
  Util::GetPropertyTable((Util *)&local_80,doc,&local_50,element,sc,no_warn);
  std::__shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->props).
              super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>,
             &local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

NodeAttribute::NodeAttribute(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Object(id,element,name)
, props()
{
    const Scope& sc = GetRequiredScope(element);

    const std::string& classname = ParseTokenAsString(GetRequiredToken(element,2));

    // hack on the deriving type but Null/LimbNode attributes are the only case in which
    // the property table is by design absent and no warning should be generated
    // for it.
    const bool is_null_or_limb = !strcmp(classname.c_str(), "Null") || !strcmp(classname.c_str(), "LimbNode");
    props = GetPropertyTable(doc,"NodeAttribute.Fbx" + classname,element,sc, is_null_or_limb);
}